

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::FillSwitch
          (ExpressionExecutor *this,Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference pvVar4;
  type vector_00;
  type result_00;
  idx_t iVar5;
  Vector *source;
  idx_t source_size;
  NotImplementedException *this_02;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  string local_70;
  string local_50;
  
  PVar1 = (result->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      TemplatedFillLoop<signed_char>(vector,result,sel,count);
      return;
    case UINT8:
      TemplatedFillLoop<unsigned_char>(vector,result,sel,count);
      return;
    case UINT16:
      TemplatedFillLoop<unsigned_short>(vector,result,sel,count);
      return;
    case INT16:
      TemplatedFillLoop<short>(vector,result,sel,count);
      return;
    case UINT32:
      TemplatedFillLoop<unsigned_int>(vector,result,sel,count);
      return;
    case INT32:
      TemplatedFillLoop<int>(vector,result,sel,count);
      return;
    case UINT64:
      TemplatedFillLoop<unsigned_long>(vector,result,sel,count);
      return;
    case INT64:
      TemplatedFillLoop<long>(vector,result,sel,count);
      return;
    default:
      goto switchD_00e9e086_caseD_a;
    case FLOAT:
      TemplatedFillLoop<float>(vector,result,sel,count);
      return;
    case DOUBLE:
      TemplatedFillLoop<double>(vector,result,sel,count);
      return;
    case INTERVAL:
      TemplatedFillLoop<duckdb::interval_t>(vector,result,sel,count);
      return;
    case LIST:
      iVar5 = ListVector::GetListSize(result);
      source = ListVector::GetEntry(vector);
      source_size = ListVector::GetListSize(vector);
      ListVector::Append(result,source,source_size,0);
      TemplatedFillLoop<duckdb::list_entry_t>(vector,result,sel,count);
      if (iVar5 != 0) {
        if (count != 0) {
          pdVar2 = result->data;
          psVar3 = sel->sel_vector;
          uVar7 = 0;
          do {
            uVar6 = uVar7;
            if (psVar3 != (sel_t *)0x0) {
              uVar6 = (ulong)psVar3[uVar7];
            }
            *(idx_t *)(pdVar2 + uVar6 * 0x10) = *(long *)(pdVar2 + uVar6 * 0x10) + iVar5;
            uVar7 = uVar7 + 1;
          } while (count != uVar7);
        }
        Vector::Verify(result,sel,(ulong)count);
        return;
      }
      break;
    case STRUCT:
      this_00 = StructVector::GetEntries(vector);
      this_01 = StructVector::GetEntries(result);
      ValidityFillLoop(vector,result,sel,count);
      if ((this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          pvVar4 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                   ::operator[](this_00,__n);
          vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar4);
          pvVar4 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                   ::operator[](this_01,__n);
          result_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar4);
          FillSwitch(this,vector_00,result_00,sel,count);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this_00->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    return;
  }
  if (PVar1 == VARCHAR) {
    TemplatedFillLoop<duckdb::string_t>(vector,result,sel,count);
    StringVector::AddHeapReference(result,vector);
    return;
  }
  if (PVar1 == UINT128) {
    TemplatedFillLoop<duckdb::uhugeint_t>(vector,result,sel,count);
    return;
  }
  if (PVar1 == INT128) {
    TemplatedFillLoop<duckdb::hugeint_t>(vector,result,sel,count);
    return;
  }
switchD_00e9e086_caseD_a:
  this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Unimplemented type for case expression: %s","");
  LogicalType::ToString_abi_cxx11_(&local_50,&result->type);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_02,&local_70,&local_50);
  __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ExpressionExecutor::FillSwitch(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	switch (result.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedFillLoop<int8_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT16:
		TemplatedFillLoop<int16_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT32:
		TemplatedFillLoop<int32_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT64:
		TemplatedFillLoop<int64_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT8:
		TemplatedFillLoop<uint8_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT16:
		TemplatedFillLoop<uint16_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT32:
		TemplatedFillLoop<uint32_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT64:
		TemplatedFillLoop<uint64_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT128:
		TemplatedFillLoop<hugeint_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT128:
		TemplatedFillLoop<uhugeint_t>(vector, result, sel, count);
		break;
	case PhysicalType::FLOAT:
		TemplatedFillLoop<float>(vector, result, sel, count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedFillLoop<double>(vector, result, sel, count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedFillLoop<interval_t>(vector, result, sel, count);
		break;
	case PhysicalType::VARCHAR:
		TemplatedFillLoop<string_t>(vector, result, sel, count);
		StringVector::AddHeapReference(result, vector);
		break;
	case PhysicalType::STRUCT: {
		auto &vector_entries = StructVector::GetEntries(vector);
		auto &result_entries = StructVector::GetEntries(result);
		ValidityFillLoop(vector, result, sel, count);
		D_ASSERT(vector_entries.size() == result_entries.size());
		for (idx_t i = 0; i < vector_entries.size(); i++) {
			FillSwitch(*vector_entries[i], *result_entries[i], sel, count);
		}
		break;
	}
	case PhysicalType::LIST: {
		idx_t offset = ListVector::GetListSize(result);
		auto &list_child = ListVector::GetEntry(vector);
		ListVector::Append(result, list_child, ListVector::GetListSize(vector));

		// all the false offsets need to be incremented by true_child.count
		TemplatedFillLoop<list_entry_t>(vector, result, sel, count);
		if (offset == 0) {
			break;
		}

		auto result_data = FlatVector::GetData<list_entry_t>(result);
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = sel.get_index(i);
			result_data[result_idx].offset += offset;
		}

		Vector::Verify(result, sel, count);
		break;
	}
	default:
		throw NotImplementedException("Unimplemented type for case expression: %s", result.GetType().ToString());
	}
}